

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixSlice.h
# Opt level: O1

iterator * __thiscall
HighsMatrixSlice<HighsTripletTreeSliceInOrder>::iterator::operator++(iterator *this)

{
  double **ppdVar1;
  int iVar2;
  iterator __position;
  pointer piVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = this->currentNode;
  lVar5 = (long)this->nodeRight[iVar4];
  if (lVar5 == -1) {
    piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this->currentNode = piVar3[-1];
    (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3 + -1;
  }
  else {
    this->currentNode = this->nodeRight[iVar4];
    if (this->nodeLeft[lVar5] != -1) {
      do {
        __position._M_current =
             (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->stack,__position,&this->currentNode);
        }
        else {
          *__position._M_current = (int)lVar5;
          (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        iVar2 = this->nodeLeft[this->currentNode];
        lVar5 = (long)iVar2;
        this->currentNode = iVar2;
      } while (this->nodeLeft[lVar5] != -1);
    }
  }
  iVar4 = this->currentNode - iVar4;
  (this->pos_).index_ = (this->pos_).index_ + iVar4;
  ppdVar1 = &(this->pos_).value_;
  *ppdVar1 = *ppdVar1 + iVar4;
  return this;
}

Assistant:

iterator& operator++() {
      HighsInt offset = -currentNode;
      if (nodeRight[currentNode] != -1) {
        currentNode = nodeRight[currentNode];
        while (nodeLeft[currentNode] != -1) {
          stack.push_back(currentNode);
          currentNode = nodeLeft[currentNode];
        }
      } else {
        currentNode = stack.back();
        stack.pop_back();
      }
      offset += currentNode;
      pos_.index_ += offset;
      pos_.value_ += offset;
      return *this;
    }